

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fFboTestCase.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::FboTestCase::FboTestCase
          (FboTestCase *this,Context *context,char *name,char *description,
          bool useScreenSizedViewport)

{
  RenderTarget *pRVar1;
  int local_78;
  int local_60;
  bool useScreenSizedViewport_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  FboTestCase *this_local;
  
  TestCase::TestCase(&this->super_TestCase,context,name,description);
  sglr::ContextWrapper::ContextWrapper(&this->super_ContextWrapper);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FboTestCase_011c4ba8;
  if (useScreenSizedViewport) {
    pRVar1 = Context::getRenderTarget(context);
    local_60 = tcu::RenderTarget::getWidth(pRVar1);
  }
  else {
    local_60 = 0x80;
  }
  this->m_viewportWidth = local_60;
  if (useScreenSizedViewport) {
    pRVar1 = Context::getRenderTarget(context);
    local_78 = tcu::RenderTarget::getHeight(pRVar1);
  }
  else {
    local_78 = 0x80;
  }
  this->m_viewportHeight = local_78;
  return;
}

Assistant:

FboTestCase::FboTestCase (Context& context, const char* name, const char* description, bool useScreenSizedViewport)
	: TestCase			(context, name, description)
	, m_viewportWidth	(useScreenSizedViewport ? context.getRenderTarget().getWidth() : 128)
	, m_viewportHeight	(useScreenSizedViewport ? context.getRenderTarget().getHeight() : 128)
{
}